

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

int armci_msg_rcvany(int tag,void *buffer,int len,int *msglen)

{
  int iVar1;
  MPI_Comm poVar2;
  int flag;
  MPI_Request request;
  int rank;
  MPI_Status status;
  
  poVar2 = wc();
  flag = 0;
  iVar1 = MPI_Comm_rank(poVar2,&rank);
  if (iVar1 != 0) {
    __assert_fail("MPI_SUCCESS == rc",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0x1b9,"int armci_msg_rcvany(int, void *, int, int *)");
  }
  if (tag != 0x6be8) {
    poVar2 = wc();
    iVar1 = MPI_Irecv(buffer,len,&ompi_mpi_char,0xffffffffffffffff,tag,poVar2,&request);
    if (iVar1 != 0) {
      __assert_fail("MPI_SUCCESS == rc",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                    ,0x1be,"int armci_msg_rcvany(int, void *, int, int *)");
    }
    do {
      MPI_Test(&request,&flag,&status);
      comex_make_progress();
    } while (flag == 0);
    if (msglen != (int *)0x0) {
      iVar1 = MPI_Get_count(&status,&ompi_mpi_char,msglen);
      if (iVar1 != 0) {
        __assert_fail("MPI_SUCCESS == rc",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                      ,0x1c9,"int armci_msg_rcvany(int, void *, int, int *)");
      }
    }
    return status.MPI_SOURCE;
  }
  __assert_fail("COMEX_TAG != tag",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                ,0x1bb,"int armci_msg_rcvany(int, void *, int, int *)");
}

Assistant:

int armci_msg_rcvany(int tag, void* buffer, int len, int *msglen)
{
    MPI_Comm comm = wc();
    MPI_Request request;
    MPI_Status status;
    int rank;
    int flag = 0;
    int rc;

    rc = MPI_Comm_rank(comm, &rank);
    assert(MPI_SUCCESS == rc);
#if COMEX_NETWORK_MPI_TS
    assert(COMEX_TAG != tag);
#endif
    rc = MPI_Irecv(buffer, len, MPI_CHAR, MPI_ANY_SOURCE, tag, wc(), &request);
    assert(MPI_SUCCESS == rc);
    do {
        MPI_Test(&request, &flag, &status);
        assert(MPI_SUCCESS == rc);
#if COMEX_NETWORK_MPI_TS
        comex_make_progress();
#endif
    } while (!flag);

    if(msglen) {
        rc = MPI_Get_count(&status, MPI_CHAR, msglen);
        assert(MPI_SUCCESS == rc);
    }

    return (int)status.MPI_SOURCE;
}